

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O1

void __thiscall
Js::InterpreterStackFrame::OP_SetArraySegmentVars
          (InterpreterStackFrame *this,OpLayoutAuxiliary *playout)

{
  AuxArray<void_*> *vars;
  
  vars = ByteCodeReader::ReadAuxArray<void*>
                   ((playout->super_OpLayoutAuxNoReg).Offset,*(FunctionBody **)(this + 0x88));
  JavascriptOperators::AddVarsToArraySegment
            (*(SparseArraySegment<void_*> **)(this + (ulong)playout->R0 * 8 + 0x160),vars);
  return;
}

Assistant:

void InterpreterStackFrame::OP_SetArraySegmentVars(const unaligned OpLayoutAuxiliary * playout)
    {
        const Js::VarArray *vars = Js::ByteCodeReader::ReadAuxArray<Var>(playout->Offset, this->GetFunctionBody());

        SparseArraySegment<Var> * segment = (SparseArraySegment<Var> *)GetNonVarReg(playout->R0);

        JavascriptOperators::AddVarsToArraySegment(segment, vars);
    }